

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  char cVar2;
  ptls_cipher_suite_t *ppVar3;
  st_ptls_on_extension_t *psVar4;
  st_ptls_get_time_t *psVar5;
  st_ptls_decompress_certificate_t *psVar6;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *sched;
  size_t sVar7;
  size_t sVar8;
  ptls_key_exchange_context_t *ppVar9;
  ptls_aead_context_t *ctx;
  ptls_key_exchange_algorithm_t *ppVar10;
  st_ptls_save_ticket_t *psVar11;
  st_ptls_update_traffic_key_t *psVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ptls_iovec_t pVar18;
  ptls_iovec_t ikm;
  ptls_iovec_t nonce;
  uint32_t uVar19;
  ushort *puVar20;
  byte bVar21;
  ushort uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  uint64_t uVar27;
  ptls_context_t *ppVar28;
  uint8_t *puVar29;
  long lVar30;
  uint8_t *puVar31;
  long lVar32;
  ptls_key_exchange_algorithm_t **pppVar33;
  ptls_message_emitter_t *emitter_00;
  undefined1 *puVar34;
  uint8_t *puVar35;
  uint uVar36;
  ptls_cipher_suite_t **pppVar37;
  ushort *puVar38;
  uint uVar39;
  ushort uVar40;
  size_t len;
  ushort *puVar41;
  ushort *puVar42;
  uint8_t *puVar43;
  ushort *puVar44;
  ushort *puVar45;
  ulong uVar46;
  ptls_iovec_t pVar47;
  ptls_iovec_t context;
  ptls_iovec_t pVar48;
  ptls_iovec_t pVar49;
  ptls_iovec_t pVar50;
  ptls_iovec_t pVar51;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar52;
  ushort local_2ba;
  uint16_t local_29e;
  uint32_t max_early_data_size;
  ptls_buffer_t ticket_buf;
  uint32_t uncompressed_size;
  undefined4 uStack_26c;
  size_t local_268;
  ushort *local_260;
  ushort *local_258;
  ushort *local_250;
  uint32_t ticket_age_add;
  uint8_t uStack_244;
  uint8_t uStack_243;
  uint8_t uStack_242;
  uint8_t uStack_241;
  ushort local_23a;
  st_ptls_server_hello_t sh;
  undefined4 extraout_var;
  
  puVar31 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  if ((tls->field_0x160 & 0x20) != 0) {
LAB_00110263:
    iVar25 = server_handle_hello(tls,emitter,message,properties);
    return iVar25;
  }
  if (0xe < tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO) {
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0x113d,
                  "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar2 = *(char *)&emitter_00->buf;
  iVar25 = 0x28;
  switch(tls->state) {
  default:
    if (is_end_of_record == 0 || cVar2 != '\x02') {
      return 10;
    }
    ticket_buf.base._0_1_ = 0;
    ticket_buf.base._1_7_ = 0;
    ticket_buf.capacity = 0;
    sh.random_[0] = '\0';
    sh.random_[1] = '\0';
    sh.random_[2] = '\0';
    sh.random_[3] = '\0';
    sh.random_[4] = '\0';
    sh.random_[5] = '\0';
    sh.random_[6] = '\0';
    sh.random_[7] = '\0';
    sh.random_[8] = '\0';
    sh.random_[9] = '\0';
    sh.random_[10] = '\0';
    sh.random_[0xb] = '\0';
    sh.random_[0xc] = '\0';
    sh.random_[0xd] = '\0';
    sh.random_[0xe] = '\0';
    sh.random_[0xf] = '\0';
    sh.random_[0x10] = '\0';
    sh.random_[0x11] = '\0';
    sh.random_[0x12] = '\0';
    sh.random_[0x13] = '\0';
    sh.random_[0x14] = '\0';
    sh.random_[0x15] = '\0';
    sh.random_[0x16] = '\0';
    sh.random_[0x17] = '\0';
    sh.random_[0x18] = '\0';
    sh.random_[0x19] = '\0';
    sh.random_[0x1a] = '\0';
    sh.random_[0x1b] = '\0';
    sh.random_[0x1c] = '\0';
    sh.random_[0x1d] = '\0';
    sh.random_[0x1e] = '\0';
    sh.random_[0x1f] = '\0';
    sh.legacy_session_id.base = (uint8_t *)0x0;
    sh.legacy_session_id.len = 0;
    sh.is_retry_request = 0;
    sh._52_4_ = 0;
    sh.field_3.peerkey.base = (uint8_t *)0x0;
    sh.field_3.peerkey.len = 0;
    sh.field_3.retry_request.cookie.len = 0;
    iVar25 = 0x32;
    puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
    if (0x25 < (long)puVar31) {
      iVar23 = bcmp((void *)((long)&emitter_00->buf + 6),hello_retry_random,0x20);
      sh.is_retry_request = (uint)(iVar23 == 0);
      puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
      if ((puVar31 != (uint8_t *)0x26) &&
         (puVar35 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->commit_message + 6),
         puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size),
         puVar35 <= puVar31 + -0x27 && puVar35 < (uint8_t *)0x21)) {
        puVar44 = (ushort *)((long)&emitter_00->buf + (long)puVar31);
        sh.legacy_session_id.base = (uint8_t *)((long)&emitter_00->commit_message + 7);
        puVar29 = (uint8_t *)((long)&emitter_00->buf + (long)puVar35);
        sh.legacy_session_id.len = (size_t)puVar35;
        puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
        if (1 < (long)puVar44 - (long)(puVar29 + 0x27)) {
          uVar40 = *(ushort *)(puVar29 + 0x27);
          pppVar37 = tls->ctx->cipher_suites;
          do {
            ppVar3 = *pppVar37;
            if (ppVar3 == (ptls_cipher_suite_t *)0x0) {
              tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
              iVar25 = 0x2f;
              puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
              goto LAB_00110c3d;
            }
            pppVar37 = pppVar37 + 1;
          } while (ppVar3->id != (uint16_t)(uVar40 << 8 | uVar40 >> 8));
          tls->cipher_suite = ppVar3;
          iVar25 = 0x2f;
          puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
          if (((ushort *)(puVar29 + 0x29) != puVar44) &&
             (puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size), puVar29[0x29] == '\0')) {
            if (iVar23 == 0) {
              sh.field_3.retry_request.selected_group = 0xffff;
            }
            ticket_age_add._0_1_ = '!';
            ticket_age_add._1_1_ = '$';
            ticket_age_add._2_1_ = '\x01';
            ticket_age_add._3_1_ = '\0';
            uStack_244 = '\0';
            uStack_243 = '$';
            uStack_242 = '\0';
            uStack_241 = '\0';
            iVar25 = 0x32;
            puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
            if (1 < (ulong)((long)puVar44 - (long)(puVar29 + 0x2a))) {
              uVar26 = (ulong)(ushort)(*(ushort *)(puVar29 + 0x2a) << 8 |
                                      *(ushort *)(puVar29 + 0x2a) >> 8);
              puVar41 = (ushort *)(puVar29 + 0x2c);
              local_258 = puVar44;
              if (uVar26 <= (ulong)((long)puVar44 - (long)puVar41)) {
                puVar42 = (ushort *)(uVar26 + (long)puVar41);
                local_29e = 0xffff;
                iVar23 = 0x32;
                local_2ba = 0xffff;
                puVar44 = puVar41;
                while( true ) {
                  uStack_26c = (undefined4)((ulong)puVar41 >> 0x20);
                  uncompressed_size = (uint32_t)puVar41;
                  if (puVar44 == puVar42) break;
                  iVar25 = iVar23;
                  if ((long)puVar42 - (long)puVar44 < 2) goto LAB_00110c3d;
                  uVar40 = *puVar44 << 8 | *puVar44 >> 8;
                  local_260 = (ushort *)CONCAT62(local_260._2_6_,uVar40);
                  uVar36 = (uint)uVar40;
                  puVar41 = puVar44 + 1;
                  uncompressed_size = (uint32_t)puVar41;
                  uStack_26c = (undefined4)((ulong)puVar41 >> 0x20);
                  if ((uVar40 < 0x40) &&
                     ((*(byte *)((long)&ticket_age_add + (ulong)(uVar40 >> 3)) >> (uVar36 & 7) & 1)
                      != 0)) {
LAB_00110fdb:
                    iVar25 = 0x2f;
                    goto LAB_00110c3d;
                  }
                  extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_age_add,uVar40);
                  uVar26 = (long)puVar42 - (long)puVar41;
                  puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                  if (uVar26 < 2) goto LAB_00110c3d;
                  uVar22 = puVar44[1] << 8 | puVar44[1] >> 8;
                  puVar45 = (ushort *)(ulong)uVar22;
                  puVar38 = puVar44 + 2;
                  uncompressed_size = (uint32_t)puVar38;
                  uStack_26c = (undefined4)((ulong)puVar38 >> 0x20);
                  puVar41 = puVar38;
                  if ((ulong)((long)puVar42 - (long)puVar38) < puVar45) goto LAB_00110c3d;
                  psVar4 = tls->ctx->on_extension;
                  if (psVar4 != (st_ptls_on_extension_t *)0x0) {
                    pVar49.len._0_2_ = uVar22;
                    pVar49.base = (uint8_t *)puVar38;
                    pVar49.len._2_6_ = 0;
                    local_250 = puVar45;
                    iVar24 = (*psVar4->cb)(psVar4,tls,'\x02',uVar40,pVar49);
                    puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                    puVar45 = local_250;
                    if (iVar24 != 0) {
                      iVar25 = 1;
                      goto LAB_00110c3d;
                    }
                  }
                  uStack_26c = (undefined4)((ulong)puVar41 >> 0x20);
                  uncompressed_size = (uint32_t)puVar41;
                  puVar38 = (ushort *)((long)puVar38 + (long)puVar45);
                  uVar39 = (uint)puVar45;
                  if ((short)local_260 == 0x29) {
                    if (sh.is_retry_request != 0) goto LAB_00110fdb;
                    if (uVar39 < 2) goto LAB_00110c3d;
                    local_2ba = puVar44[2] << 8 | puVar44[2] >> 8;
LAB_001101c8:
                    puVar45 = puVar44 + 3;
                    puVar20 = puVar44 + 3;
                  }
                  else if (uVar36 == 0x33) {
                    if (sh.is_retry_request == 0) {
                      iVar25 = decode_key_share_entry
                                         ((uint16_t *)&max_early_data_size,&sh.field_3.peerkey,
                                          (uint8_t **)&uncompressed_size,(uint8_t *)puVar38);
                      puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                      if ((iVar25 != 0) ||
                         (puVar45 = (ushort *)CONCAT44(uStack_26c,uncompressed_size),
                         iVar25 = iVar23, puVar45 != puVar38)) goto LAB_00110c3d;
                      if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
                         (puVar20 = puVar45, tls->key_share->id != (ushort)max_early_data_size))
                      goto LAB_00110fdb;
                    }
                    else {
                      if (uVar39 < 2) goto LAB_00110c3d;
                      sh.field_3.retry_request.selected_group = puVar44[2] << 8 | puVar44[2] >> 8;
                      puVar45 = puVar44 + 3;
                      puVar20 = puVar44 + 3;
                    }
                  }
                  else {
                    puVar45 = puVar38;
                    if (uVar36 == 0x2c) {
                      if (sh.is_retry_request == 0) goto LAB_00110fdb;
                      if (uVar39 < 2) goto LAB_00110c3d;
                      uVar26 = (ulong)(ushort)(puVar44[2] << 8 | puVar44[2] >> 8);
                      puVar20 = puVar44 + 3;
                      if ((ulong)((long)puVar38 - (long)puVar20) <= uVar26 - 1) goto LAB_00110c3d;
                      puVar41 = (ushort *)((long)puVar44 + uVar26 + 6);
                      sh.field_3.retry_request.cookie.len = (long)puVar41 - (long)puVar20;
                      sh.field_3.retry_request.cookie.base = (uint8_t *)puVar20;
                      puVar20 = puVar41;
                      if (puVar41 != puVar38) goto LAB_00110c3d;
                    }
                    else {
                      puVar20 = puVar38;
                      if (uVar36 == 0x2b) {
                        if (1 < uVar39) {
                          local_29e = puVar44[2] << 8 | puVar44[2] >> 8;
                          goto LAB_001101c8;
                        }
                        goto LAB_00110c3d;
                      }
                    }
                  }
                  puVar41 = puVar20;
                  puVar44 = puVar45;
                  iVar25 = iVar23;
                  if (puVar45 != puVar38) goto LAB_00110c3d;
                }
                if (puVar42 == local_258) {
                  iVar23 = is_supported_version(local_29e);
                  iVar25 = 0x2f;
                  puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                  if (iVar23 != 0) {
                    iVar23 = sh.is_retry_request;
                    if (sh.is_retry_request == 0) {
                      if (local_2ba != 0xffff) {
                        puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                        if ((local_2ba != 0) ||
                           (puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size),
                           ((tls->field_20).server.pending_traffic_secret[0x28] & 1) == 0))
                        goto LAB_00110c3d;
                        tls->field_0x160 = tls->field_0x160 | 2;
                      }
                      if ((sh.field_3.peerkey.base == (uint8_t *)0x0) &&
                         (puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size),
                         (tls->field_0x160 & 2) == 0)) goto LAB_00110c3d;
                    }
                    iVar25 = 0x2f;
                    puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                    if (sh.legacy_session_id.len == 0x20) {
                      iVar24 = (*ptls_mem_equal)(sh.legacy_session_id.base,&tls->field_20,0x20);
                      puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                      if (iVar24 != 0) {
                        uVar36 = 0;
                        if (iVar23 == 0) {
                          if (((tls->field_20).server.pending_traffic_secret[0x28] & 1) != 0) {
                            uVar36 = (uint)((tls->field_0x160 & 2) == 0);
                          }
                          iVar25 = key_schedule_select_one
                                             (tls->key_schedule,tls->cipher_suite,uVar36);
                          if ((iVar25 == 0) &&
                             ((sh.field_3.peerkey.base == (uint8_t *)0x0 ||
                              (pVar48.len = sh.field_3.peerkey.len,
                              pVar48.base = sh.field_3.peerkey.base,
                              iVar25 = (*((tls->field_20).client.key_share_ctx)->on_exchange)
                                                 (&(tls->field_20).client.key_share_ctx,1,
                                                  (ptls_iovec_t *)&ticket_buf,pVar48), iVar25 == 0))
                             )) {
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
                            ikm.base._1_7_ = ticket_buf.base._1_7_;
                            ikm.base._0_1_ = ticket_buf.base._0_1_;
                            ikm.len = ticket_buf.capacity;
                            iVar25 = key_schedule_extract(tls->key_schedule,ikm);
                            if ((iVar25 == 0) &&
                               (iVar25 = setup_traffic_protection(tls,0,"s hs traffic",2,0),
                               iVar25 == 0)) {
                              if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
                                iVar25 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_00111383:
                                if (iVar25 != 0) goto LAB_001112e1;
LAB_0011138b:
                                tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                                iVar25 = 0x202;
                                puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                              }
                              else {
                                puVar31 = (uint8_t *)malloc(0x40);
                                tls->pending_handshake_secret = puVar31;
                                if (puVar31 != (uint8_t *)0x0) {
                                  iVar25 = derive_secret(tls->key_schedule,puVar31,"c hs traffic");
                                  if (iVar25 == 0) {
                                    psVar12 = tls->ctx->update_traffic_key;
                                    if (psVar12 != (st_ptls_update_traffic_key_t *)0x0) {
                                      iVar25 = (*psVar12->cb)(psVar12,tls,1,2,
                                                              tls->pending_handshake_secret);
                                      goto LAB_00111383;
                                    }
                                    goto LAB_0011138b;
                                  }
                                  goto LAB_001112e1;
                                }
                                iVar25 = 0x201;
                                puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                              }
                              goto LAB_00110c3d;
                            }
                          }
                        }
                        else {
                          iVar25 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
                          if (iVar25 == 0) {
                            ppVar9 = (tls->field_20).client.key_share_ctx;
                            if (ppVar9 != (ptls_key_exchange_context_t *)0x0) {
                              pppVar1 = &(tls->field_20).client.key_share_ctx;
                              (*ppVar9->on_exchange)
                                        (pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
                              *pppVar1 = (ptls_key_exchange_context_t *)0x0;
                            }
                            bVar21 = (tls->field_20).server.pending_traffic_secret[0x28];
                            if ((bVar21 & 2) != 0) {
                              if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)
                              {
                                ctx = (tls->traffic_protection).enc.aead;
                                if (ctx == (ptls_aead_context_t *)0x0) {
                                  __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                                                ,0x892,
                                                "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                               );
                                }
                                ptls_aead_free(ctx);
                                (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                                bVar21 = (tls->field_20).server.pending_traffic_secret[0x28];
                              }
                              (tls->field_20).server.pending_traffic_secret[0x28] = bVar21 & 0xfd;
                            }
                            if (sh.field_3.retry_request.selected_group == 0xffff) {
                              if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                                return 0x2f;
                              }
                            }
                            else {
                              pppVar33 = tls->ctx->key_exchanges;
                              do {
                                ppVar10 = *pppVar33;
                                if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) {
                                  return 0x2f;
                                }
                                pppVar33 = pppVar33 + 1;
                              } while (ppVar10->id != sh.field_3.retry_request.selected_group);
                              tls->key_share = ppVar10;
                            }
                            key_schedule_transform_post_ch1hash(tls->key_schedule);
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
                            iVar25 = send_client_hello(tls,emitter,properties,
                                                       &sh.field_3.retry_request.cookie);
                            return iVar25;
                          }
                        }
LAB_001112e1:
                        puVar41 = (ushort *)CONCAT44(uStack_26c,uncompressed_size);
                      }
                    }
                  }
                }
                else {
                  iVar25 = 0x32;
                }
              }
            }
          }
        }
      }
    }
LAB_00110c3d:
    uStack_26c = (undefined4)((ulong)puVar41 >> 0x20);
    uncompressed_size = (uint32_t)puVar41;
    if ((void *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_) == (void *)0x0) {
      return iVar25;
    }
    (*ptls_clear_memory)
              ((void *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_),ticket_buf.capacity);
    puVar29 = (uint8_t *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_);
    goto LAB_00110c5a;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar2 != '\b') {
      return 10;
    }
    sh.random_[0] = 0xff;
    sh.random_[1] = 0xff;
    ticket_buf.base._0_1_ = 0x20;
    ticket_buf.base._1_7_ = 0x83a00000020;
    if ((((ulong)puVar31 & 0xfffffffffffffffe) != 4) &&
       (uVar40 = *(ushort *)((long)&emitter_00->buf + 4),
       puVar35 = (uint8_t *)(ulong)(ushort)(uVar40 << 8 | uVar40 >> 8), puVar35 <= puVar31 + -6)) {
      local_250 = (ushort *)((long)&emitter_00->buf + (long)puVar31);
      puVar44 = (ushort *)((uint8_t *)((long)&emitter_00->buf + (long)puVar35) + 6);
      local_258 = (ushort *)0x0;
      local_260 = (ushort *)0x0;
      puVar41 = (ushort *)((long)&emitter_00->buf + 6);
      while (puVar41 != puVar44) {
        if ((long)puVar44 - (long)puVar41 < 2) {
          return 0x32;
        }
        uVar40 = *puVar41 << 8 | *puVar41 >> 8;
        uVar36 = (uint)uVar40;
        if ((uVar40 < 0x40) &&
           ((*(byte *)((long)&ticket_buf.base + (ulong)(uVar40 >> 3)) >> (uVar36 & 7) & 1) != 0)) {
          return 0x2f;
        }
        extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_buf,uVar40);
        if ((ulong)((long)puVar44 - (long)(puVar41 + 1)) < 2) goto LAB_001106fb;
        uVar22 = puVar41[1] << 8 | puVar41[1] >> 8;
        uVar26 = (ulong)uVar22;
        puVar42 = puVar41 + 2;
        if ((ulong)((long)puVar44 - (long)puVar42) < uVar26) goto LAB_001106fb;
        ppVar28 = tls->ctx;
        psVar4 = ppVar28->on_extension;
        if (psVar4 != (st_ptls_on_extension_t *)0x0) {
          pVar51.len._0_2_ = uVar22;
          pVar51.base = (uint8_t *)puVar42;
          pVar51.len._2_6_ = 0;
          iVar25 = (*psVar4->cb)(psVar4,tls,'\b',uVar40,pVar51);
          ppVar28 = (ptls_context_t *)CONCAT44(extraout_var,iVar25);
          if (iVar25 != 0) {
            return 1;
          }
        }
        puVar38 = (ushort *)((long)puVar42 + uVar26);
        if (uVar40 == 0) {
          if (uVar26 != 0) goto LAB_001106fb;
          if (tls->server_name == (char *)0x0) {
            return 0x2f;
          }
          iVar25 = ptls_server_name_is_ipaddr(tls->server_name);
          puVar41 = puVar38;
          if (iVar25 != 0) {
            return 0x2f;
          }
        }
        else if (uVar36 == 0x10) {
          if (uVar22 < 2) goto LAB_001106fb;
          uVar26 = (ulong)(ushort)(puVar41[2] << 8 | puVar41[2] >> 8);
          puVar42 = puVar41 + 3;
          if (((ulong)((long)puVar38 - (long)puVar42) < uVar26) || (uVar26 == 0)) goto LAB_001106fb;
          puVar45 = (ushort *)(uVar26 + (long)puVar42);
          uVar26 = (ulong)(byte)puVar41[3];
          puVar35 = (uint8_t *)((long)puVar41 + 7);
          if (((ulong)((long)puVar45 - (long)puVar35) < uVar26) || (uVar26 == 0)) goto LAB_001106fb;
          puVar42 = (ushort *)((long)puVar42 + uVar26 + 1);
          iVar25 = ptls_set_negotiated_protocol(tls,(char *)puVar35,(long)puVar42 - (long)puVar35);
          if (iVar25 != 0) {
            return iVar25;
          }
          if (puVar42 != puVar45) {
            return 0x28;
          }
          puVar41 = puVar38;
          if (puVar45 != puVar38) {
            return 0x32;
          }
        }
        else if (uVar36 == 0x2a) {
          local_258 = (ushort *)CONCAT71((int7)((ulong)ppVar28 >> 8),1);
          puVar41 = puVar38;
          if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
            return 0x2f;
          }
        }
        else if (uVar36 == 0xffce) {
          puVar41 = puVar38;
          local_260 = puVar42;
          if (uVar22 != 0x10) {
            return 0x2f;
          }
        }
        else {
          handle_unknown_extension
                    (tls,properties,uVar40,(uint8_t *)puVar42,(uint8_t *)puVar38,
                     (ptls_raw_extension_t *)&sh);
          puVar41 = puVar38;
        }
      }
      if (puVar44 == local_250) {
        if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
          if (local_260 != (ushort *)0x0) {
            return 0x2f;
          }
        }
        else {
          if (local_260 == (ushort *)0x0) {
            return 0x2f;
          }
          iVar25 = (*ptls_mem_equal)(local_260,tls->esni->nonce,0x10);
          if (iVar25 == 0) {
            return 0x2f;
          }
          free_esni_secret(&tls->esni,0);
        }
        bVar21 = (tls->field_20).server.pending_traffic_secret[0x28];
        if ((bVar21 & 2) != 0) {
          if (((ulong)local_258 & 1) == 0) {
            (tls->field_20).server.pending_traffic_secret[0x28] = bVar21 & 0xfd;
          }
          if (properties != (ptls_handshake_properties_t *)0x0) {
            (properties->field_0).client.early_data_acceptance =
                 ((byte)local_258 & 1) + PTLS_EARLY_DATA_REJECTED;
          }
        }
        iVar25 = report_unknown_extensions(tls,properties,(ptls_raw_extension_t *)&sh);
        if (iVar25 != 0) {
          return iVar25;
        }
        ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
        bVar21 = (tls->field_0x160 & 2) >> 1;
        tls->state = (uint)bVar21 + (uint)bVar21 * 2 +
                     PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
        goto LAB_00110903;
      }
    }
LAB_001106fb:
    iVar25 = 0x32;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar2 == '\v') {
LAB_00110716:
      iVar25 = client_do_handle_certificate
                         (tls,(uint8_t *)((long)&emitter_00->buf + 4),
                          (uint8_t *)((long)&emitter_00->buf + (long)puVar31));
      if (iVar25 != 0) {
        return iVar25;
      }
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    }
    else {
      if (cVar2 == '\x19') goto LAB_001108b3;
      if (cVar2 != '\r') {
        return 10;
      }
      if (puVar31 == (uint8_t *)0x4) {
        return 0x32;
      }
      puVar35 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
      if (puVar31 + -5 < puVar35) {
        return 0x32;
      }
      puVar41 = (ushort *)((long)&emitter_00->buf + 5);
      puVar44 = (ushort *)((long)puVar41 + (long)puVar35);
      puVar29 = (uint8_t *)0x1;
      if (puVar35 != (uint8_t *)0x0) {
        puVar29 = puVar35;
      }
      puVar29 = (uint8_t *)malloc((size_t)puVar29);
      (tls->field_20).client.certificate_request.context.base = puVar29;
      if (puVar29 != (uint8_t *)0x0) {
        (tls->field_20).client.certificate_request.context.len = (size_t)puVar35;
        memcpy(puVar29,puVar41,(size_t)puVar35);
        puVar41 = puVar44;
      }
      iVar25 = 0x32;
      if (puVar41 == puVar44) {
        iVar25 = 0x201;
      }
      if (puVar29 == (uint8_t *)0x0) {
        return 0x201;
      }
      if (puVar41 != puVar44) {
        return iVar25;
      }
      puVar41 = (ushort *)((long)&emitter_00->buf + (long)puVar31);
      ticket_buf.base._0_1_ = 1;
      ticket_buf.base._1_7_ = 0x83e00000104;
      if ((ulong)((long)puVar41 - (long)puVar44) < 2) {
        return 0x32;
      }
      uVar26 = (ulong)(ushort)(*puVar44 << 8 | *puVar44 >> 8);
      puVar44 = puVar44 + 1;
      if ((ulong)((long)puVar41 - (long)puVar44) < uVar26) {
        return 0x32;
      }
      puVar38 = (ushort *)(uVar26 + (long)puVar44);
      puVar42 = (ushort *)sh.random_._0_8_;
      while (sh.random_._0_8_ = puVar42, puVar44 != puVar38) {
        if ((long)puVar38 - (long)puVar44 < 2) {
          return 0x32;
        }
        uVar40 = *puVar44 << 8 | *puVar44 >> 8;
        if ((uVar40 < 0x40) &&
           ((*(byte *)((long)&ticket_buf.base + (ulong)(uVar40 >> 3)) >> (uVar40 & 7) & 1) != 0)) {
          return 0x2f;
        }
        extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_buf,uVar40);
        if ((ulong)((long)puVar38 - (long)(puVar44 + 1)) < 2) {
          return 0x32;
        }
        uVar22 = puVar44[1] << 8 | puVar44[1] >> 8;
        puVar44 = puVar44 + 2;
        if ((ulong)((long)puVar38 - (long)puVar44) < (ulong)uVar22) {
          return 0x32;
        }
        psVar4 = tls->ctx->on_extension;
        sh.random_._0_8_ = puVar44;
        if ((psVar4 != (st_ptls_on_extension_t *)0x0) &&
           (pVar50.len._0_2_ = uVar22, pVar50.base = (uint8_t *)puVar44, pVar50.len._2_6_ = 0,
           iVar25 = (*psVar4->cb)(psVar4,tls,'\r',uVar40,pVar50), iVar25 != 0)) {
          return 1;
        }
        puVar44 = (ushort *)((long)puVar44 + (ulong)uVar22);
        puVar42 = puVar44;
        if ((uVar40 == 0xd) &&
           (iVar25 = decode_signature_algorithms
                               (&(tls->field_20).client.certificate_request.signature_algorithms,
                                (uint8_t **)&sh,(uint8_t *)puVar44), iVar25 != 0)) {
          return iVar25;
        }
      }
      if (puVar38 != puVar41) goto LAB_001106fb;
      if ((tls->field_20).client.certificate_request.signature_algorithms.count == 0) {
        return 0x6d;
      }
      if ((tls->field_20).client.certificate_request.context.len != 0) {
        return 0x2f;
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
    }
    goto LAB_00110903;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar2 != '\x19') {
      if (cVar2 != '\v') {
        return 10;
      }
      goto LAB_00110716;
    }
LAB_001108b3:
    if (tls->ctx->decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
      iVar25 = 10;
    }
    else {
      iVar25 = 0x32;
      if (5 < (long)puVar31) {
        puVar35 = (uint8_t *)((long)&emitter_00->buf + (long)puVar31);
        uVar40 = *(ushort *)((long)&emitter_00->buf + 4);
        puVar34 = (undefined1 *)((long)&emitter_00->buf + 6);
        ticket_buf.base._0_1_ = SUB81(puVar34,0);
        ticket_buf.base._1_7_ = (undefined7)((ulong)puVar34 >> 8);
        iVar25 = ptls_decode24(&uncompressed_size,&ticket_buf.base,puVar35);
        uVar19 = uncompressed_size;
        if (iVar25 == 0) {
          uVar26 = (ulong)uncompressed_size;
          if (uVar26 < 0x10001) {
            puVar29 = (uint8_t *)malloc(uVar26);
            if (puVar29 == (uint8_t *)0x0) {
              iVar25 = 0x201;
              goto LAB_00110912;
            }
            lVar32 = CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_);
            iVar25 = 0x32;
            if (2 < (ulong)((long)puVar35 - lVar32)) {
              lVar30 = 0;
              uVar46 = 0;
              do {
                uVar46 = (ulong)*(byte *)(lVar32 + lVar30) | uVar46 << 8;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
              puVar43 = (uint8_t *)(lVar32 + 3);
              if ((ulong)((long)puVar35 - (long)puVar43) < uVar46) {
LAB_00110c2a:
                iVar25 = 0x32;
              }
              else {
                psVar6 = tls->ctx->decompress_certificate;
                pVar18.len = uVar46;
                pVar18.base = puVar43;
                pVar47.len._0_4_ = uVar19;
                pVar47.base = puVar29;
                pVar47.len._4_4_ = 0;
                sh.random_._0_8_ = puVar43;
                sh.random_._8_8_ = uVar46;
                iVar25 = (*psVar6->cb)(psVar6,tls,uVar40 << 8 | uVar40 >> 8,pVar47,pVar18);
                if (iVar25 == 0) {
                  if (puVar43 + uVar46 != puVar35) goto LAB_00110c2a;
                  iVar25 = client_do_handle_certificate(tls,puVar29,puVar29 + uVar26);
                  if (iVar25 == 0) {
                    ptls__key_schedule_update_hash
                              (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
                    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                    iVar25 = 0x202;
                  }
                }
              }
            }
          }
          else {
            puVar29 = (uint8_t *)0x0;
            iVar25 = 0x2a;
          }
        }
        else {
          puVar29 = (uint8_t *)0x0;
        }
        goto LAB_00110c5a;
      }
    }
LAB_00110912:
    puVar29 = (uint8_t *)0x0;
LAB_00110c5a:
    free(puVar29);
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar2 != '\x0f') {
      return 10;
    }
    iVar25 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar25 != 0) {
      return iVar25;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
    goto LAB_00110903;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar2 != '\x14') {
      return 10;
    }
    iVar25 = verify_finished(tls,message);
    if (iVar25 == 0) {
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
      iVar25 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar25 == 0) &&
           (iVar25 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar25 == 0)) &&
          (iVar25 = derive_secret(tls->key_schedule,&sh,"c ap traffic"), iVar25 == 0)) &&
         (iVar25 = derive_exporter_secret(tls,0), iVar25 == 0)) {
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
LAB_001111ce:
          puVar31 = (tls->field_20).client.certificate_request.context.base;
          if (puVar31 == (uint8_t *)0x0) {
LAB_00111231:
            iVar25 = push_change_cipher_spec(tls,emitter->buf);
            if (iVar25 == 0) {
              send_finished(tls,emitter);
              *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) = sh._48_8_;
              *(uint8_t **)((tls->traffic_protection).enc.secret + 0x38) = sh.field_3.peerkey.base;
              *(uint8_t **)((tls->traffic_protection).enc.secret + 0x20) = sh.legacy_session_id.base
              ;
              *(size_t *)((tls->traffic_protection).enc.secret + 0x28) = sh.legacy_session_id.len;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = sh.random_._16_8_;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = sh.random_._24_8_;
              *(undefined8 *)(tls->traffic_protection).enc.secret = sh.random_._0_8_;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = sh.random_._8_8_;
              iVar25 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
              if (iVar25 == 0) {
                tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
                iVar25 = 0;
              }
            }
          }
          else if ((tls->field_0x160 & 2) == 0) {
            context.len = (tls->field_20).client.certificate_request.context.len;
            context.base = puVar31;
            iVar25 = send_certificate_and_certificate_verify
                               (tls,emitter,
                                &(tls->field_20).client.certificate_request.signature_algorithms,
                                context,"TLS 1.3, client CertificateVerify",0);
            free((tls->field_20).client.certificate_request.context.base);
            (tls->field_20).client.certificate_request.context.base = (uint8_t *)0x0;
            (tls->field_20).client.certificate_request.context.len = 0;
            if (iVar25 == 0) goto LAB_00111231;
          }
          else {
            iVar25 = 0x2f;
          }
        }
        else {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                          ,0xb25,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          bVar21 = (tls->field_20).server.pending_traffic_secret[0x28];
          if (((bVar21 & 2) == 0) || ((tls->ctx->field_0x68 & 0x10) != 0)) {
LAB_001111ba:
            (tls->field_20).server.pending_traffic_secret[0x28] = bVar21 & 0xfd;
            iVar25 = commission_handshake_secret(tls);
            if (iVar25 == 0) goto LAB_001111ce;
          }
          else {
            iVar25 = (*emitter->begin_message)(emitter);
            if (iVar25 == 0) {
              buf = emitter->buf;
              sched = tls->key_schedule;
              sVar7 = buf->off;
              ticket_buf.base._0_1_ = 5;
              iVar25 = ptls_buffer__do_pushv(buf,&ticket_buf,1);
              if ((iVar25 == 0) && (iVar25 = ptls_buffer__do_pushv(buf,"",3), iVar25 == 0)) {
                sVar8 = buf->off;
                for (lVar32 = -3; lVar32 != 0; lVar32 = lVar32 + 1) {
                  buf->base[lVar32 + sVar8] = '\0';
                }
                if (sched != (ptls_key_schedule_t *)0x0) {
                  ptls__key_schedule_update_hash(sched,buf->base + sVar7,buf->off - sVar7);
                }
                iVar25 = (*emitter->commit_message)(emitter);
                if (iVar25 == 0) {
                  bVar21 = (tls->field_20).server.pending_traffic_secret[0x28];
                  goto LAB_001111ba;
                }
              }
            }
          }
        }
      }
    }
    (*ptls_clear_memory)(&sh,0x40);
    break;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    if (is_end_of_record != 0 && cVar2 == '\x01') goto LAB_00110263;
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    if (cVar2 != '\v') {
      return 10;
    }
    iVar25 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                                (uint8_t *)((long)&emitter_00->buf + (long)puVar31),(int *)&sh);
    if (iVar25 != 0) {
      return iVar25;
    }
    if (sh.random_._0_4_ == 0) {
      return 0x74;
    }
    ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
    tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
    goto LAB_00110903;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (cVar2 != '\x0f') {
      return 10;
    }
    iVar25 = handle_certificate_verify(tls,message,"TLS 1.3, client CertificateVerify");
    if (iVar25 != 0) {
      return iVar25;
    }
    goto LAB_001108fc;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if ((tls->ctx->field_0x68 & 0x10) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x1117,
                    "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (cVar2 != '\x05') {
      return 10;
    }
    iVar25 = commission_handshake_secret(tls);
    if (iVar25 != 0) {
      return iVar25;
    }
    ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
LAB_001108fc:
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
LAB_00110903:
    iVar25 = 0x202;
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if ((is_end_of_record != 0 && cVar2 == '\x14') &&
       (iVar25 = verify_finished(tls,message), iVar25 == 0)) {
      uVar13 = *(undefined8 *)&tls->field_20;
      uVar14 = *(undefined8 *)((long)&tls->field_20 + 8);
      uVar15 = *(undefined8 *)((long)&tls->field_20 + 0x10);
      uVar16 = *(undefined8 *)((long)&tls->field_20 + 0x18);
      ppVar9 = (tls->field_20).client.key_share_ctx;
      uVar17 = *(undefined8 *)((long)&tls->field_20 + 0x28);
      sVar7 = (tls->field_20).client.certificate_request.context.len;
      *(uint8_t **)((tls->traffic_protection).dec.secret + 0x30) =
           (tls->field_20).client.certificate_request.context.base;
      *(size_t *)((tls->traffic_protection).dec.secret + 0x38) = sVar7;
      *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x20) = ppVar9;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar17;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x10) = uVar15;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x18) = uVar16;
      *(undefined8 *)(tls->traffic_protection).dec.secret = uVar13;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 8) = uVar14;
      (*ptls_clear_memory)(&tls->field_20,0x40);
      iVar25 = setup_traffic_protection(tls,0,(char *)0x0,3,0);
      if (iVar25 == 0) {
        ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar31);
        tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
        iVar25 = 0;
      }
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar2 == '\x18') {
LAB_00110894:
      message_00.len = 0x28;
      message_00.base = puVar31;
      iVar25 = handle_key_update(tls,emitter_00,message_00);
      return iVar25;
    }
    iVar25 = 10;
    if (cVar2 == '\x04') {
      puVar35 = (uint8_t *)((long)&emitter_00->buf + 4);
      iVar25 = decode_new_session_ticket
                         (tls,(uint32_t *)&ticket_buf,&ticket_age_add,
                          (ptls_iovec_t *)&uncompressed_size,(ptls_iovec_t *)&sh,
                          &max_early_data_size,puVar35,
                          (uint8_t *)((long)&emitter_00->buf + (long)puVar31));
      if (iVar25 == 0) {
        if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
          iVar25 = 0;
        }
        else {
          ticket_buf.base._0_1_ = SUB81(&sh,0);
          ticket_buf.base._1_7_ = (undefined7)((ulong)&sh >> 8);
          ticket_buf.off = 0;
          ticket_buf.capacity = 0x200;
          ticket_buf.is_allocated = 0;
          psVar5 = tls->ctx->get_time;
          uVar27 = (*psVar5->cb)(psVar5);
          _ticket_age_add =
               (uint8_t  [8])
               (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38);
          iVar25 = ptls_buffer__do_pushv(&ticket_buf,&ticket_age_add,8);
          if (iVar25 == 0) {
            uVar40 = tls->key_share->id;
            max_early_data_size._0_2_ = uVar40 << 8 | uVar40 >> 8;
            iVar25 = ptls_buffer__do_pushv(&ticket_buf,&max_early_data_size,2);
            if (iVar25 == 0) {
              uVar40 = tls->cipher_suite->id;
              local_23a = uVar40 << 8 | uVar40 >> 8;
              iVar25 = ptls_buffer__do_pushv(&ticket_buf,&local_23a,2);
              if (((iVar25 == 0) &&
                  (iVar25 = ptls_buffer__do_pushv(&ticket_buf,"",3), sVar7 = ticket_buf.off,
                  iVar25 == 0)) &&
                 (iVar25 = ptls_buffer__do_pushv(&ticket_buf,puVar35,(size_t)(puVar31 + -4)),
                 iVar25 == 0)) {
                puVar34 = (undefined1 *)
                          (sVar7 + CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_) + -3);
                for (lVar32 = 0x10; lVar32 != -8; lVar32 = lVar32 + -8) {
                  *puVar34 = (char)(ticket_buf.off - sVar7 >> ((byte)lVar32 & 0x3f));
                  puVar34 = puVar34 + 1;
                }
                iVar25 = ptls_buffer__do_pushv(&ticket_buf,"",2);
                sVar7 = ticket_buf.off;
                if ((iVar25 == 0) &&
                   (iVar25 = ptls_buffer_reserve(&ticket_buf,
                                                 (tls->key_schedule->hashes[0].algo)->digest_size),
                   sVar8 = ticket_buf.off, iVar25 == 0)) {
                  puVar31 = (uint8_t *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_);
                  nonce.base._4_4_ = uStack_26c;
                  nonce.base._0_4_ = uncompressed_size;
                  nonce.len = local_268;
                  iVar25 = derive_resumption_secret
                                     (tls->key_schedule,puVar31 + ticket_buf.off,nonce);
                  if (iVar25 == 0) {
                    ticket_buf.off = sVar8 + (tls->key_schedule->hashes[0].algo)->digest_size;
                    puVar31[sVar7 - 2] = (uint8_t)(ticket_buf.off - sVar7 >> 8);
                    puVar31[sVar7 - 1] = (uint8_t)(ticket_buf.off - sVar7);
                    psVar11 = tls->ctx->save_ticket;
                    pVar52.len = ticket_buf.off;
                    pVar52.base = puVar31;
                    iVar25 = (*psVar11->cb)(psVar11,tls,pVar52);
                  }
                }
              }
            }
          }
          ptls_buffer_dispose(&ticket_buf);
        }
      }
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    iVar25 = 10;
    if (cVar2 == '\x18') goto LAB_00110894;
  }
  return iVar25;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                    ptls_handshake_properties_t *properties)
{
    int ret;
    if (tls->in_handshake)
        return(server_handle_hello(tls, emitter, message, properties));
    uint8_t type = message.base[0];

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}